

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

void __thiscall
google::protobuf::Map<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>::
insert<google::protobuf::Map<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>::const_iterator>
          (Map<std::__cxx11::string,CoreML::Specification::MILSpec::Argument> *this,
          const_iterator first,const_iterator last)

{
  Argument *from;
  value_type *key;
  Argument *this_00;
  iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>::KeyValuePair>
  local_68;
  pair<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>::InnerMap::iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>::KeyValuePair>,_unsigned_long>
  local_50;
  
  local_68.node_ = first.it_.node_;
  local_68.m_ = first.it_.m_;
  local_68.bucket_index_ = first.it_.bucket_index_;
  if (first.it_.node_ != last.it_.node_) {
    do {
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
      ::InnerMap::FindHelper
                (&local_50,*(InnerMap **)(this + 0x10),&(((local_68.node_)->kv).v_)->first,
                 (TreeIterator *)0x0);
      if (local_50.first.node_ == (Node *)0x0) {
        key = ((local_68.node_)->kv).v_;
        from = &key->second;
        this_00 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
                  ::operator[]((Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
                                *)this,&key->first);
        if (from != this_00) {
          internal::RepeatedPtrFieldBase::
          Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::MILSpec::Argument_Binding>::TypeHandler>
                    (&(this_00->arguments_).super_RepeatedPtrFieldBase);
          CoreML::Specification::MILSpec::Argument::MergeFrom(this_00,from);
        }
      }
      Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
      ::InnerMap::
      iterator_base<const_google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>::KeyValuePair>
      ::operator++(&local_68);
    } while (local_68.node_ != last.it_.node_);
  }
  return;
}

Assistant:

void insert(InputIt first, InputIt last) {
    for (InputIt it = first; it != last; ++it) {
      iterator exist_it = find(it->first);
      if (exist_it == end()) {
        operator[](it->first) = it->second;
      }
    }
  }